

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O0

string * __thiscall
libcellml::nodesCellMl1XVersion_abi_cxx11_
          (string *__return_storage_ptr__,libcellml *this,XmlNodePtr *node)

{
  bool bVar1;
  element_type *this_00;
  allocator<char> local_2d [20];
  allocator<char> local_19;
  libcellml *local_18;
  XmlNodePtr *node_local;
  
  local_18 = this;
  node_local = (XmlNodePtr *)__return_storage_ptr__;
  this_00 = std::__shared_ptr_access<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)this);
  bVar1 = XmlNode::isCellml10Element(this_00,(char *)0x0);
  if (bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"1.0",&local_19);
    std::allocator<char>::~allocator(&local_19);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"1.1",local_2d);
    std::allocator<char>::~allocator(local_2d);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string nodesCellMl1XVersion(const XmlNodePtr &node)
{
    if (node->isCellml10Element()) {
        return "1.0";
    }

    return "1.1";
}